

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::TestQuoteMeta(string *unquoted,Options *options)

{
  bool bVar1;
  ostream *poVar2;
  StringPiece *in_RDX;
  string quoted;
  RE2 re;
  string local_2a0;
  LogMessageFatal local_280;
  RE2 local_100;
  
  local_280.super_LogMessage._0_8_ = (unquoted->_M_dataplus)._M_p;
  local_280.super_LogMessage._8_4_ = SUB84(unquoted->_M_string_length,0);
  RE2::QuoteMeta_abi_cxx11_(&local_2a0,(RE2 *)&local_280,in_RDX);
  local_280.super_LogMessage._0_8_ = local_2a0._M_dataplus._M_p;
  local_280.super_LogMessage._8_4_ = (int)local_2a0._M_string_length;
  RE2::RE2(&local_100,(StringPiece *)&local_280,options);
  local_280.super_LogMessage._0_8_ = (unquoted->_M_dataplus)._M_p;
  local_280.super_LogMessage._8_4_ = SUB84(unquoted->_M_string_length,0);
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_280,&local_100);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x185);
    poVar2 = std::operator<<((ostream *)&local_280.super_LogMessage.str_,
                             "Check failed: RE2::FullMatch(unquoted, re)");
    poVar2 = std::operator<<(poVar2,"Unquoted=\'");
    poVar2 = std::operator<<(poVar2,(string *)unquoted);
    poVar2 = std::operator<<(poVar2,"\', quoted=\'");
    poVar2 = std::operator<<(poVar2,(string *)&local_2a0);
    std::operator<<(poVar2,"\'.");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  RE2::~RE2(&local_100);
  std::__cxx11::string::~string((string *)&local_2a0);
  return;
}

Assistant:

static void TestQuoteMeta(string unquoted,
                          const RE2::Options& options = RE2::DefaultOptions) {
  string quoted = RE2::QuoteMeta(unquoted);
  RE2 re(quoted, options);
  EXPECT_TRUE(RE2::FullMatch(unquoted, re))
      << "Unquoted='" << unquoted << "', quoted='" << quoted << "'.";
}